

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QCborNegativeInteger n)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  size_t sVar2;
  QIODevice *this_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  byte bVar7;
  size_t __n;
  long lVar8;
  long in_FS_OFFSET;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  uVar4 = n - 1;
  sVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10);
  if (sVar2 != 0) {
    *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10) = sVar2 - 1;
  }
  lVar8 = (long)&local_10 + 7;
  uVar3 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
          (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
          (uVar4 & 0xff00) << 0x28;
  local_10 = uVar3 | uVar4 << 0x38;
  if (uVar4 < 0x18) {
    __n = (size_t)(byte)((byte)uVar4 | 0x20);
    local_10._0_7_ = (undefined7)uVar3;
    local_10 = CONCAT17((byte)uVar4,(undefined7)local_10) | 0x2000000000000000;
  }
  else {
    cVar6 = '\x02';
    if (uVar4 < 0x10000) {
      cVar6 = 0xff < uVar4;
    }
    bVar7 = (cVar6 + '\x01') - (uVar4 >> 0x20 == 0);
    lVar5 = -1L << (bVar7 & 0x3f);
    lVar8 = lVar8 + lVar5;
    __n = (ulong)bVar7 | 0x38;
    *(char *)((long)&local_10 + lVar5 + 7) = (char)__n;
  }
  this_00 = *(QIODevice **)*(uint8_t **)((long)&(_Var1._M_head_impl)->encoder + 8);
  if (this_00 != (QIODevice *)0x0) {
    QIODevice::write(this_00,(int)lVar8,(void *)((long)&local_8 - lVar8),__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QCborNegativeInteger n)
{
    d->executeAppend(cbor_encode_negative_int, uint64_t(n));
}